

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O3

void __thiscall
WordSplitOnceTest_random_Test<char>::TestBody(WordSplitOnceTest_random_Test<char> *this)

{
  char in_R8B;
  char *pcVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  split_result;
  RandomWordTestData<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  data;
  AssertHelper local_100 [8];
  Message local_f8;
  undefined7 uStack_f7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  RandomWordTestData<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  
  RandomWordTestData<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RandomWordTestData(&local_88,'\0',0,0);
  jessilib::
  word_split_once<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
            (&local_c8,(jessilib *)local_88.m_str._M_dataplus._M_p,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_88.m_str._M_dataplus._M_p + local_88.m_str._M_string_length),
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )0x0,in_R8B);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_e8,"split_result.first","data.m_tokens[0]",&local_c8.first,
             local_88.m_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message(&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x88,pcVar1);
    testing::internal::AssertHelper::operator=(local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_100);
    if ((long *)CONCAT71(uStack_f7,local_f8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_f7,local_f8) + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  RandomWordTestData<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get_remainder((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                  &local_88,1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_f8,"split_result.second","data.get_remainder(1)",&local_c8.second,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
  }
  if (local_f8 == (Message)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x89,pcVar1);
    testing::internal::AssertHelper::operator=(local_100,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_100);
    if ((long *)CONCAT71(local_e8._1_7_,local_e8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_e8._1_7_,local_e8[0]) + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.second._M_dataplus._M_p != &local_c8.second.field_2) {
    operator_delete(local_c8.second._M_dataplus._M_p,
                    local_c8.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p != &local_c8.first.field_2) {
    operator_delete(local_c8.first._M_dataplus._M_p,local_c8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_88.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.m_token_indexes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88.m_tokens);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_str._M_dataplus._M_p != &local_88.m_str.field_2) {
    operator_delete(local_88.m_str._M_dataplus._M_p,local_88.m_str.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_delim._M_dataplus._M_p != &local_88.m_delim.field_2) {
    operator_delete(local_88.m_delim._M_dataplus._M_p,
                    local_88.m_delim.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(WordSplitOnceTest, random) {
	RandomWordTestData<TypeParam> data{};
	std::pair<std::basic_string<TypeParam>, std::basic_string<TypeParam>> split_result = word_split_once(data.m_str, default_delim<TypeParam>);

	EXPECT_EQ(split_result.first, data.m_tokens[0]);
	EXPECT_EQ(split_result.second, data.get_remainder(1));
}